

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lax_der_parsing.c
# Opt level: O2

int ecdsa_signature_parse_der_lax
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *input,size_t inputlen)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uchar tmpsig [64];
  uchar auStack_38 [8];
  
  tmpsig[0x30] = '\0';
  tmpsig[0x31] = '\0';
  tmpsig[0x32] = '\0';
  tmpsig[0x33] = '\0';
  tmpsig[0x34] = '\0';
  tmpsig[0x35] = '\0';
  tmpsig[0x36] = '\0';
  tmpsig[0x37] = '\0';
  tmpsig[0x38] = '\0';
  tmpsig[0x39] = '\0';
  tmpsig[0x3a] = '\0';
  tmpsig[0x3b] = '\0';
  tmpsig[0x3c] = '\0';
  tmpsig[0x3d] = '\0';
  tmpsig[0x3e] = '\0';
  tmpsig[0x3f] = '\0';
  tmpsig[0x20] = '\0';
  tmpsig[0x21] = '\0';
  tmpsig[0x22] = '\0';
  tmpsig[0x23] = '\0';
  tmpsig[0x24] = '\0';
  tmpsig[0x25] = '\0';
  tmpsig[0x26] = '\0';
  tmpsig[0x27] = '\0';
  tmpsig[0x28] = '\0';
  tmpsig[0x29] = '\0';
  tmpsig[0x2a] = '\0';
  tmpsig[0x2b] = '\0';
  tmpsig[0x2c] = '\0';
  tmpsig[0x2d] = '\0';
  tmpsig[0x2e] = '\0';
  tmpsig[0x2f] = '\0';
  tmpsig[0x10] = '\0';
  tmpsig[0x11] = '\0';
  tmpsig[0x12] = '\0';
  tmpsig[0x13] = '\0';
  tmpsig[0x14] = '\0';
  tmpsig[0x15] = '\0';
  tmpsig[0x16] = '\0';
  tmpsig[0x17] = '\0';
  tmpsig[0x18] = '\0';
  tmpsig[0x19] = '\0';
  tmpsig[0x1a] = '\0';
  tmpsig[0x1b] = '\0';
  tmpsig[0x1c] = '\0';
  tmpsig[0x1d] = '\0';
  tmpsig[0x1e] = '\0';
  tmpsig[0x1f] = '\0';
  tmpsig[0] = '\0';
  tmpsig[1] = '\0';
  tmpsig[2] = '\0';
  tmpsig[3] = '\0';
  tmpsig[4] = '\0';
  tmpsig[5] = '\0';
  tmpsig[6] = '\0';
  tmpsig[7] = '\0';
  tmpsig[8] = '\0';
  tmpsig[9] = '\0';
  tmpsig[10] = '\0';
  tmpsig[0xb] = '\0';
  tmpsig[0xc] = '\0';
  tmpsig[0xd] = '\0';
  tmpsig[0xe] = '\0';
  tmpsig[0xf] = '\0';
  secp256k1_ecdsa_signature_parse_compact(ctx,sig,tmpsig);
  iVar3 = 0;
  iVar10 = 0;
  if (((inputlen != 0) && (inputlen != 1)) && (iVar10 = iVar3, *input == '0')) {
    bVar1 = input[1];
    if ((char)bVar1 < '\0') {
      if (inputlen - 2 < (ulong)bVar1 - 0x80) {
        return 0;
      }
      sVar7 = (ulong)bVar1 - 0x7e;
    }
    else {
      sVar7 = 2;
    }
    if (((sVar7 != inputlen) && (input[sVar7] == '\x02')) && (sVar7 + 1 != inputlen)) {
      lVar5 = sVar7 + 2;
      uVar4 = (ulong)input[sVar7 + 1];
      if ((char)input[sVar7 + 1] < '\0') {
        if (inputlen - lVar5 < uVar4 - 0x80) {
          return 0;
        }
        lVar13 = uVar4 + sVar7 + -0x7e;
        uVar14 = 0;
        uVar9 = uVar4 - 0x80;
        while (uVar9 != 0) {
          if (input[lVar5] != '\0') {
            uVar14 = uVar9;
            lVar13 = lVar5;
            if (7 < uVar9) {
              return 0;
            }
            break;
          }
          lVar5 = lVar5 + 1;
          uVar9 = uVar9 - 1;
        }
        uVar4 = 0;
        for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
          uVar4 = uVar4 << 8 | (ulong)input[uVar11 + lVar13];
        }
        lVar5 = lVar13 + uVar14;
      }
      if (((uVar4 <= inputlen - lVar5) && (sVar7 = lVar5 + uVar4, sVar7 != inputlen)) &&
         ((input[sVar7] == '\x02' && (sVar7 + 1 != inputlen)))) {
        lVar13 = sVar7 + 2;
        uVar14 = (ulong)input[sVar7 + 1];
        if ((char)input[sVar7 + 1] < '\0') {
          if (inputlen - lVar13 < uVar14 - 0x80) {
            return 0;
          }
          lVar6 = sVar7 + uVar14 + -0x7e;
          uVar9 = 0;
          uVar11 = uVar14 - 0x80;
          while (uVar11 != 0) {
            if (input[lVar13] != '\0') {
              uVar9 = uVar11;
              lVar6 = lVar13;
              if (7 < uVar11) {
                return 0;
              }
              break;
            }
            lVar13 = lVar13 + 1;
            uVar11 = uVar11 - 1;
          }
          uVar14 = 0;
          for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
            uVar14 = uVar14 << 8 | (ulong)input[uVar12 + lVar6];
          }
          lVar13 = lVar6 + uVar9;
        }
        if (uVar14 <= inputlen - lVar13) {
          lVar6 = 0;
          while( true ) {
            bVar2 = true;
            sVar8 = uVar4 - lVar6;
            if (sVar8 == 0) break;
            if (input[lVar6 + lVar5] != '\0') {
              if (sVar8 < 0x21) {
                memcpy(tmpsig + (lVar6 - uVar4) + 0x20,input + lVar6 + lVar5,sVar8);
              }
              else {
                bVar2 = false;
              }
              break;
            }
            lVar6 = lVar6 + 1;
          }
          iVar10 = 1;
          for (lVar5 = 0; sVar8 = uVar14 - lVar5, sVar8 != 0; lVar5 = lVar5 + 1) {
            if (input[lVar5 + lVar13] != '\0') {
              if (0x20 < sVar8) goto LAB_0010bcff;
              memcpy(tmpsig + (lVar5 - uVar14) + 0x40,input + lVar5 + lVar13,sVar8);
              break;
            }
          }
          if ((!bVar2) ||
             (iVar3 = secp256k1_ecdsa_signature_parse_compact(ctx,sig,tmpsig), iVar3 == 0)) {
LAB_0010bcff:
            tmpsig[0x30] = '\0';
            tmpsig[0x31] = '\0';
            tmpsig[0x32] = '\0';
            tmpsig[0x33] = '\0';
            tmpsig[0x34] = '\0';
            tmpsig[0x35] = '\0';
            tmpsig[0x36] = '\0';
            tmpsig[0x37] = '\0';
            tmpsig[0x38] = '\0';
            tmpsig[0x39] = '\0';
            tmpsig[0x3a] = '\0';
            tmpsig[0x3b] = '\0';
            tmpsig[0x3c] = '\0';
            tmpsig[0x3d] = '\0';
            tmpsig[0x3e] = '\0';
            tmpsig[0x3f] = '\0';
            tmpsig[0x20] = '\0';
            tmpsig[0x21] = '\0';
            tmpsig[0x22] = '\0';
            tmpsig[0x23] = '\0';
            tmpsig[0x24] = '\0';
            tmpsig[0x25] = '\0';
            tmpsig[0x26] = '\0';
            tmpsig[0x27] = '\0';
            tmpsig[0x28] = '\0';
            tmpsig[0x29] = '\0';
            tmpsig[0x2a] = '\0';
            tmpsig[0x2b] = '\0';
            tmpsig[0x2c] = '\0';
            tmpsig[0x2d] = '\0';
            tmpsig[0x2e] = '\0';
            tmpsig[0x2f] = '\0';
            tmpsig[0x10] = '\0';
            tmpsig[0x11] = '\0';
            tmpsig[0x12] = '\0';
            tmpsig[0x13] = '\0';
            tmpsig[0x14] = '\0';
            tmpsig[0x15] = '\0';
            tmpsig[0x16] = '\0';
            tmpsig[0x17] = '\0';
            tmpsig[0x18] = '\0';
            tmpsig[0x19] = '\0';
            tmpsig[0x1a] = '\0';
            tmpsig[0x1b] = '\0';
            tmpsig[0x1c] = '\0';
            tmpsig[0x1d] = '\0';
            tmpsig[0x1e] = '\0';
            tmpsig[0x1f] = '\0';
            tmpsig[0] = '\0';
            tmpsig[1] = '\0';
            tmpsig[2] = '\0';
            tmpsig[3] = '\0';
            tmpsig[4] = '\0';
            tmpsig[5] = '\0';
            tmpsig[6] = '\0';
            tmpsig[7] = '\0';
            tmpsig[8] = '\0';
            tmpsig[9] = '\0';
            tmpsig[10] = '\0';
            tmpsig[0xb] = '\0';
            tmpsig[0xc] = '\0';
            tmpsig[0xd] = '\0';
            tmpsig[0xe] = '\0';
            tmpsig[0xf] = '\0';
            secp256k1_ecdsa_signature_parse_compact(ctx,sig,tmpsig);
          }
        }
      }
    }
  }
  return iVar10;
}

Assistant:

int ecdsa_signature_parse_der_lax(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const unsigned char *input, size_t inputlen) {
    size_t rpos, rlen, spos, slen;
    size_t pos = 0;
    size_t lenbyte;
    unsigned char tmpsig[64] = {0};
    int overflow = 0;

    /* Hack to initialize sig with a correctly-parsed but invalid signature. */
    secp256k1_ecdsa_signature_parse_compact(ctx, sig, tmpsig);

    /* Sequence tag byte */
    if (pos == inputlen || input[pos] != 0x30) {
        return 0;
    }
    pos++;

    /* Sequence length bytes */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        pos += lenbyte;
    }

    /* Integer tag byte for R */
    if (pos == inputlen || input[pos] != 0x02) {
        return 0;
    }
    pos++;

    /* Integer length for R */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        while (lenbyte > 0 && input[pos] == 0) {
            pos++;
            lenbyte--;
        }
        if (lenbyte >= sizeof(size_t)) {
            return 0;
        }
        rlen = 0;
        while (lenbyte > 0) {
            rlen = (rlen << 8) + input[pos];
            pos++;
            lenbyte--;
        }
    } else {
        rlen = lenbyte;
    }
    if (rlen > inputlen - pos) {
        return 0;
    }
    rpos = pos;
    pos += rlen;

    /* Integer tag byte for S */
    if (pos == inputlen || input[pos] != 0x02) {
        return 0;
    }
    pos++;

    /* Integer length for S */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        while (lenbyte > 0 && input[pos] == 0) {
            pos++;
            lenbyte--;
        }
        if (lenbyte >= sizeof(size_t)) {
            return 0;
        }
        slen = 0;
        while (lenbyte > 0) {
            slen = (slen << 8) + input[pos];
            pos++;
            lenbyte--;
        }
    } else {
        slen = lenbyte;
    }
    if (slen > inputlen - pos) {
        return 0;
    }
    spos = pos;

    /* Ignore leading zeroes in R */
    while (rlen > 0 && input[rpos] == 0) {
        rlen--;
        rpos++;
    }
    /* Copy R value */
    if (rlen > 32) {
        overflow = 1;
    } else if (rlen) {
        memcpy(tmpsig + 32 - rlen, input + rpos, rlen);
    }

    /* Ignore leading zeroes in S */
    while (slen > 0 && input[spos] == 0) {
        slen--;
        spos++;
    }
    /* Copy S value */
    if (slen > 32) {
        overflow = 1;
    } else if (slen) {
        memcpy(tmpsig + 64 - slen, input + spos, slen);
    }

    if (!overflow) {
        overflow = !secp256k1_ecdsa_signature_parse_compact(ctx, sig, tmpsig);
    }
    if (overflow) {
        memset(tmpsig, 0, 64);
        secp256k1_ecdsa_signature_parse_compact(ctx, sig, tmpsig);
    }
    return 1;
}